

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdfastpfor.h
# Opt level: O0

void __thiscall FastPForLib::SIMDFastPFor<4U>::SIMDFastPFor(SIMDFastPFor<4U> *this,uint32_t ps)

{
  uint32_t uVar1;
  undefined4 in_ESI;
  IntegerCODEC *in_RDI;
  allocator_type *in_stack_ffffffffffffffc0;
  allocator_type *__a;
  vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
  *this_00;
  allocator_type local_1d [17];
  undefined4 local_c;
  
  local_c = in_ESI;
  IntegerCODEC::IntegerCODEC(in_RDI);
  in_RDI->_vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_00468aa8;
  *(undefined4 *)&in_RDI[1]._vptr_IntegerCODEC = local_c;
  uVar1 = gccbits(*(uint32_t *)&in_RDI[1]._vptr_IntegerCODEC);
  *(uint32_t *)((long)&in_RDI[1]._vptr_IntegerCODEC + 4) = uVar1;
  this_00 = (vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
             *)(in_RDI + 2);
  std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>
  ::allocator((allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>
               *)0x12d0e0);
  std::
  vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
  ::vector(this_00,(size_type)in_RDI,in_stack_ffffffffffffffc0);
  std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>
  ::~allocator((allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>
                *)0x12d100);
  __a = local_1d;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x12d132);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,(size_type)in_RDI,__a)
  ;
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x12d152);
  return;
}

Assistant:

SIMDFastPFor(uint32_t ps = 65536)
      : PageSize(ps), bitsPageSize(gccbits(PageSize)), datatobepacked(33),
        bytescontainer(PageSize + 3 * PageSize / BlockSize) {
    assert(ps / BlockSize * BlockSize == ps);
    assert(gccbits(static_cast<uint32_t>(BlockSizeInUnitsOfPackSize * PACKSIZE - 1)) <= 8);
  }